

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

bool libtorrent::aux::anon_unknown_135::trigger_announce
               (session_interface *ses,bool is_ssl,bool complete_sent,reannounce_flags_t flags,
               time_point t,announce_entry *e)

{
  byte *pbVar1;
  pointer paVar2;
  pointer paVar3;
  pointer paVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  
  refresh_endpoint_list(ses,is_ssl,complete_sent,e);
  paVar2 = (e->endpoints).
           super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar3 = (e->endpoints).
           super__Vector_base<libtorrent::aux::announce_endpoint,_std::allocator<libtorrent::aux::announce_endpoint>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (paVar2 != paVar3) {
    iVar5 = (int)(SUB168(SEXT816((long)t.__d.__r) * SEXT816(0x112e0be826d694b3),8) >> 0x1a) -
            (SUB164(SEXT816((long)t.__d.__r) * SEXT816(0x112e0be826d694b3),0xc) >> 0x1f);
    paVar4 = paVar2;
    do {
      lVar6 = 100;
      do {
        iVar7 = iVar5;
        if (((flags.m_val & 1) == 0) &&
           (iVar7 = *(int *)((long)(paVar4->info_hashes).
                                   super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems +
                            lVar6 + -0x30), iVar7 <= iVar5)) {
          iVar7 = iVar5;
        }
        *(int *)((long)(paVar4->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                       _M_elems + lVar6 + -0x34) = iVar7 + 1;
        *(int *)((long)(paVar4->info_hashes).super_array<libtorrent::aux::announce_infohash,_2UL>.
                       _M_elems + lVar6 + -0x30) = iVar7 + 1;
        pbVar1 = (byte *)((long)(paVar4->info_hashes).
                                super_array<libtorrent::aux::announce_infohash,_2UL>._M_elems +
                         lVar6 + -0x1f);
        *pbVar1 = *pbVar1 | 4;
        lVar6 = lVar6 + 0x48;
      } while (lVar6 != 0xf4);
      paVar4 = paVar4 + 1;
    } while (paVar4 != paVar3);
  }
  return paVar2 != paVar3;
}

Assistant:

bool trigger_announce(aux::session_interface& ses
		, bool const is_ssl
		, bool const complete_sent
		, reannounce_flags_t const flags
		, time_point const t
		, aux::announce_entry& e)
	{
		bool ret = false;
		// make sure we check for new endpoints from the listen sockets
		refresh_endpoint_list(ses, is_ssl, complete_sent, e);
		for (auto& aep : e.endpoints)
		{
			for (auto& a : aep.info_hashes)
			{
				a.next_announce = (flags & torrent_handle::ignore_min_interval)
					? time_point_cast<seconds32>(t) + seconds32(1)
					: std::max(time_point_cast<seconds32>(t), a.min_announce) + seconds32(1);
				a.min_announce = a.next_announce;
				a.triggered_manually = true;
				ret = true;
			}
		}
		return ret;
	}